

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.hpp
# Opt level: O0

function<void_(int)> * __thiscall
function<void_(int)>::operator=(function<void_(int)> *this,function<void_(int)> *other)

{
  function<void_(int)> *other_local;
  function<void_(int)> *this_local;
  
  if (this != other) {
    reset(this);
    this->vtable_ = other->vtable_;
    if (this->vtable_ != (vtable *)0x0) {
      (*this->vtable_->move)(other,this);
    }
    reset(other);
  }
  return this;
}

Assistant:

function<R(Args...)> & function<R(Args...)>::operator = (function && other) noexcept
{
	if (this == &other)
		return *this;

	reset();
	vtable_ = other.vtable_;
	if (vtable_)
		vtable_->move(&other.storage_, &storage_);
	other.reset();
	return *this;
}